

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O3

FIOBJ fiobj_hash_replace(FIOBJ hash,FIOBJ key,FIOBJ obj)

{
  uint uVar1;
  FIOBJ hash_value;
  fiobj_object_vtable_s *pfVar2;
  FIOBJ old;
  fio_str_info_s s;
  FIOBJ local_40;
  fio_str_info_s local_38;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0xf0,"FIOBJ fiobj_hash_replace(FIOBJ, FIOBJ, FIOBJ)");
  }
  local_40 = 0;
  if (((uint)key & 7) == 2) {
    hash_value = fiobj_str_hash(key);
    goto LAB_0014295f;
  }
  uVar1 = (uint)key & 6;
  hash_value = key;
  if (((uVar1 == 6) || (key == 0)) || ((key & 1) != 0)) goto LAB_0014295f;
  if ((key & 6) == 0) {
    switch(*(undefined1 *)(key & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar2 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_0014291f_caseD_28;
    case 0x29:
      pfVar2 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_0014291f_caseD_2a;
    case 0x2b:
      pfVar2 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar2 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar1 == 2) {
switchD_0014291f_caseD_28:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_0014291f_caseD_2a:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
  }
  (*pfVar2->to_str)(&local_38,key);
  hash_value = fio_siphash13(local_38.data,local_38.len,0x1456f2,0x145bc9);
LAB_0014295f:
  fio_hash___insert((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,key,obj,&local_40);
  fiobj_free(obj);
  return local_40;
}

Assistant:

FIOBJ fiobj_hash_replace(FIOBJ hash, FIOBJ key, FIOBJ obj) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old = FIOBJ_INVALID;
  fio_hash___insert(&obj2hash(hash)->hash, fiobj_obj2hash(key), key, obj, &old);
  fiobj_free(obj); /* take ownership - free the user's reference. */
  return old;
}